

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.h
# Opt level: O1

failure_formatter_t * __thiscall bandit::detail::controller_t::get_formatter(controller_t *this)

{
  interface *ptr;
  string local_60;
  string local_40;
  
  ptr = (this->formatter)._M_t.
        super___uniq_ptr_impl<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
        ._M_t.
        super__Tuple_impl<0UL,_bandit::failure_formatter::interface_*,_std::default_delete<bandit::failure_formatter::interface>_>
        .super__Head_base<0UL,_bandit::failure_formatter::interface_*,_false>._M_head_impl;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"formatter","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"bandit::detail::controller_t::set_formatter()","");
  throw_if_nullptr(ptr,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return (this->formatter)._M_t.
         super___uniq_ptr_impl<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
         ._M_t.
         super__Tuple_impl<0UL,_bandit::failure_formatter::interface_*,_std::default_delete<bandit::failure_formatter::interface>_>
         .super__Head_base<0UL,_bandit::failure_formatter::interface_*,_false>._M_head_impl;
}

Assistant:

failure_formatter_t& get_formatter() {
        throw_if_nullptr(formatter.get(), "formatter", "bandit::detail::controller_t::set_formatter()");
        return *formatter;
      }